

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_filesystem.cpp
# Opt level: O1

path * __thiscall Omega_h::filesystem::path::extension(path *__return_storage_ptr__,path *this)

{
  int iVar1;
  long lVar2;
  string_type filename_str;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  filename((path *)&local_60,this);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,local_60._M_dataplus._M_p,
             local_60._M_dataplus._M_p + local_60._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  lVar2 = std::__cxx11::string::rfind((char)local_40,0x2e);
  if (lVar2 != -1) {
    iVar1 = std::__cxx11::string::compare((char *)local_40);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)local_40);
      if ((iVar1 != 0) && (lVar2 != 0)) {
        std::__cxx11::string::substr((ulong)&local_60,(ulong)local_40);
        path(__return_storage_ptr__,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002c1dca;
      }
    }
  }
  (__return_storage_ptr__->impl)._M_dataplus._M_p = (pointer)0x0;
  (__return_storage_ptr__->impl)._M_string_length = 0;
  (__return_storage_ptr__->impl).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->impl).field_2 + 8) = 0;
  (__return_storage_ptr__->impl)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->impl).field_2
  ;
  (__return_storage_ptr__->impl)._M_string_length = 0;
  (__return_storage_ptr__->impl).field_2._M_local_buf[0] = '\0';
LAB_002c1dca:
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

path path::extension() const {
  auto const filename_str = filename().native();
  auto const last_dot_pos = filename_str.find_last_of('.');
  // If the pathname is either . or .., or if filename() does not contain the .
  // character, then empty path is returned.
  if (last_dot_pos == std::string::npos) return path();
  if (filename_str == "." || filename_str == "..") return path();
  // If the first character in the filename is a period, that period is ignored
  // (a filename like ".profile" is not treated as an extension)
  if (last_dot_pos == 0) return path();
  // If the filename() component of the generic-format path contains a period
  // (.), and is not one of the special filesystem elements dot or dot-dot, then
  // the extension is the substring beginning at the rightmost period (including
  // the period) and until the end of the pathname.
  return filename_str.substr(last_dot_pos, std::string::npos);
}